

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLight.cpp
# Opt level: O1

double __thiscall PointLight::shadow(PointLight *this,Scene *scene,Vector *p,Vector *l)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double t;
  Ray r;
  SurfaceData texture;
  double local_f8;
  double local_f0;
  double local_e8;
  Vector local_e0;
  double local_c8;
  double local_c0;
  double local_b8;
  SurfaceData local_b0;
  GeometricObject *this_00;
  
  dVar3 = (this->loc).x - p->x;
  dVar4 = (this->loc).y - p->y;
  dVar2 = (this->loc).z - p->z;
  l->x = dVar3;
  l->y = dVar4;
  l->z = dVar2;
  local_f0 = dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4;
  if (local_f0 < 0.0) {
    local_f0 = sqrt(local_f0);
  }
  else {
    local_f0 = SQRT(local_f0);
  }
  dVar2 = this->dist_scale / local_f0;
  dVar2 = dVar2 * dVar2;
  local_c8 = l->x / local_f0;
  l->x = local_c8;
  local_c0 = l->y / local_f0;
  l->y = local_c0;
  local_b8 = l->z / local_f0;
  l->z = local_b8;
  local_e0.x = p->x;
  local_e0.y = p->y;
  local_e0.z = p->z;
  iVar1 = (*scene->_vptr_Scene[2])(scene,&local_e0,&local_e8);
  this_00 = (GeometricObject *)CONCAT44(extraout_var,iVar1);
  if ((this_00 != (GeometricObject *)0x0) && (local_e8 < local_f0)) {
    local_f8 = dVar2;
    while( true ) {
      local_e0.x = local_c8 * local_e8 + local_e0.x;
      local_e0.y = local_c0 * local_e8 + local_e0.y;
      local_e0.z = local_e8 * local_b8 + local_e0.z;
      GeometricObject::find_texture(this_00,&local_e0,&local_b0);
      dVar2 = 0.0;
      if ((local_b0.kt < threshold) || (local_f8 = local_f8 * local_b0.kt, local_f8 < threshold))
      break;
      local_f0 = local_f0 - local_e8;
      iVar1 = (*scene->_vptr_Scene[2])(scene,&local_e0,&local_e8);
      this_00 = (GeometricObject *)CONCAT44(extraout_var_00,iVar1);
      if (this_00 == (GeometricObject *)0x0) {
        return local_f8;
      }
      if (local_f0 <= local_e8) {
        return local_f8;
      }
    }
  }
  return dVar2;
}

Assistant:

double PointLight::shadow(Scene* scene, Vector&  p, Vector& l)
{
   l = loc - p;

   double t;
   double dist = !l;
   double attenuation = dist_scale  / dist;
   attenuation = attenuation *   attenuation;

   l /= dist;

   Ray   r(p,l);
   SurfaceData texture;
   GeometricObject *occlude;

   while ((occlude = scene->intersect(r,t)) != 0 && dist > t)
   {
      r.org = r.point(t);

      occlude->find_texture(r.org, texture);

      if (texture.kt < threshold) return 0; // объект непрозрачен
      if ((attenuation *= texture.kt) < threshold) return 0;
      dist -= t;
   }
   return attenuation;
}